

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O1

int AF_AActor_GetDropItems
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  undefined8 *puVar1;
  PClass *pPVar2;
  undefined8 uVar3;
  PClass *pPVar4;
  int iVar5;
  char *__assertion;
  bool bVar6;
  bool bVar7;
  
  pPVar2 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
  }
  else {
    if (((param->field_0).field_3.Type == '\x03') &&
       (((param->field_0).field_1.atag == 1 || ((param->field_0).field_1.a == (void *)0x0)))) {
      puVar1 = (undefined8 *)(param->field_0).field_1.a;
      if (puVar1 != (undefined8 *)0x0) {
        if (puVar1[1] == 0) {
          uVar3 = (**(code **)*puVar1)(puVar1);
          puVar1[1] = uVar3;
        }
        pPVar4 = (PClass *)puVar1[1];
        bVar6 = pPVar4 == (PClass *)0x0;
        bVar7 = !bVar6;
        defaultparam = (TArray<VMValue,_VMValue> *)(ulong)(pPVar4 == pPVar2 || bVar6);
        if (pPVar4 != pPVar2 && !bVar6) {
          do {
            pPVar4 = pPVar4->ParentClass;
            bVar7 = pPVar4 != (PClass *)0x0;
            if (pPVar4 == pPVar2) break;
          } while (pPVar4 != (PClass *)0x0);
        }
        if (!bVar7) {
          __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_00433181;
        }
      }
      if (puVar1[1] == 0) {
        uVar3 = (**(code **)*puVar1)(puVar1,defaultparam);
        puVar1[1] = uVar3;
      }
      if (numret < 1) {
        iVar5 = 0;
      }
      else {
        if (ret == (VMReturn *)0x0) {
          __assert_fail("ret != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                        ,0x1c97,
                        "int AF_AActor_GetDropItems(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        iVar5 = 1;
        VMReturn::SetPointer(ret,*(void **)(puVar1[1] + 0x1b8),1);
      }
      return iVar5;
    }
    __assertion = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
  }
LAB_00433181:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                ,0x1c96,
                "int AF_AActor_GetDropItems(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, GetDropItems)
{
	PARAM_SELF_PROLOGUE(AActor);
	ACTION_RETURN_OBJECT(self->GetDropItems());
}